

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O2

int check_txfm_eval(MACROBLOCK *x,BLOCK_SIZE bsize,int64_t best_skip_rd,int64_t skip_rd,int level,
                   int is_luma_only)

{
  long lVar1;
  long lVar2;
  undefined7 in_register_00000031;
  long lVar3;
  
  lVar1 = (long)level;
  if ((long)(ulong)(x->source_variance <<
                   ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                    [CONCAT71(in_register_00000031,bsize) & 0xffffffff] + 7 & 0x1f)) < best_skip_rd)
  {
    if (x->qindex < *(int *)(&DAT_004bfde0 + lVar1 * 4)) {
      lVar2 = 4;
    }
    else {
      lVar2 = (long)*(int *)(&DAT_004bfdc0 + lVar1 * 4) << 2;
    }
    lVar3 = 0x7fffffffffffffff;
    if (best_skip_rd == 0x7fffffffffffffff) goto LAB_0034ac6b;
  }
  else {
    lVar2 = 4;
  }
  lVar3 = lVar2 * best_skip_rd * (long)*(int *)(&DAT_004bfe00 + lVar1 * 4) >> 6;
LAB_0034ac6b:
  return (int)(skip_rd <= lVar3);
}

Assistant:

static inline int check_txfm_eval(MACROBLOCK *const x, BLOCK_SIZE bsize,
                                  int64_t best_skip_rd, int64_t skip_rd,
                                  int level, int is_luma_only) {
  int eval_txfm = 1;
  // Derive aggressiveness factor for gating the transform search
  // Lower value indicates more aggressiveness. Be more conservative (high
  // value) for (i) low quantizers (ii) regions where prediction is poor
  const int scale[MAX_TX_RD_GATE_LEVEL + 1] = { INT_MAX, 4, 3, 2, 2, 1 };
  const int qslope = 2 * (!is_luma_only);
  const int level_to_qindex_map[MAX_TX_RD_GATE_LEVEL + 1] = { 0,  0,   0,
                                                              80, 100, 140 };
  int aggr_factor = 4;
  assert(level <= MAX_TX_RD_GATE_LEVEL);
  const int pred_qindex_thresh = level_to_qindex_map[level];
  if (!is_luma_only && level <= 2) {
    aggr_factor = 4 * AOMMAX(1, ROUND_POWER_OF_TWO((MAXQ - x->qindex) * qslope,
                                                   QINDEX_BITS));
  }
  if ((best_skip_rd >
       (x->source_variance << (num_pels_log2_lookup[bsize] + RDDIV_BITS))) &&
      (x->qindex >= pred_qindex_thresh))
    aggr_factor *= scale[level];
  // For level setting 1, be more conservative for non-luma-only case even when
  // prediction is good.
  else if ((level <= 1) && !is_luma_only)
    aggr_factor = (aggr_factor >> 2) * 6;

  // Be more conservative for luma only cases (called from compound type rd)
  // since best_skip_rd is computed after and skip_rd is computed (with 8-bit
  // prediction signals blended for WEDGE/DIFFWTD rather than 16-bit) before
  // interpolation filter search
  const int luma_mul[MAX_TX_RD_GATE_LEVEL + 1] = {
    INT_MAX, 32, 29, 17, 17, 17
  };
  int mul_factor = is_luma_only ? luma_mul[level] : 16;
  int64_t rd_thresh =
      (best_skip_rd == INT64_MAX)
          ? best_skip_rd
          : (int64_t)(best_skip_rd * aggr_factor * mul_factor >> 6);
  if (skip_rd > rd_thresh) eval_txfm = 0;
  return eval_txfm;
}